

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_> __thiscall
Parser::parseFunctionDeclaration(Parser *this)

{
  Mark MVar1;
  Mark *pMVar2;
  variant_alternative_t<0UL,_variant<basic_string<char>,_double>_> *pvVar3;
  Stream *in_RSI;
  TypeName type;
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
  args;
  undefined1 local_78 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  
  pMVar2 = Stream::getMark(in_RSI);
  MVar1 = *pMVar2;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"Expected function declaration!",(allocator<char> *)&name);
  expectToken((Parser *)in_RSI,KeywordFn,(string *)local_78);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&args,"Expected function name!",(allocator<char> *)&type);
  getToken((Token *)local_78,(Parser *)in_RSI,Identifier,(string *)&args);
  pvVar3 = std::get<0ul,std::__cxx11::string,double>
                     ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                       *)(local_78 + 8));
  std::__cxx11::string::string((string *)&name,(string *)pvVar3);
  std::__detail::__variant::
  _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                       *)(local_78 + 8));
  std::__cxx11::string::~string((string *)&args);
  parseArgumentList_abi_cxx11_(&args,(Parser *)in_RSI);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"Expected colon!",(allocator<char> *)&type);
  expectToken((Parser *)in_RSI,Colon,(string *)local_78);
  std::__cxx11::string::~string((string *)local_78);
  type = parseType((Parser *)in_RSI);
  parseBlock((Parser *)local_78);
  std::
  make_unique<FunctionDeclarationNode,std::__cxx11::string_const&,TypeName_const&,std::__cxx11::list<std::pair<std::__cxx11::string,TypeName>,std::allocator<std::pair<std::__cxx11::string,TypeName>>>const&,std::unique_ptr<BlockNode,std::default_delete<BlockNode>>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             (TypeName *)&name,
             (list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
              *)&type,(unique_ptr<BlockNode,_std::default_delete<BlockNode>_> *)&args);
  *(Mark *)((this->tokenizer_).stream_.is_ + 8) = MVar1;
  if ((long *)local_78._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_78._0_8_ + 8))();
  }
  std::__cxx11::
  _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
  ::_M_clear(&args.
              super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
            );
  std::__cxx11::string::~string((string *)&name);
  return (__uniq_ptr_data<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>,_true,_true>
          )(__uniq_ptr_data<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<FunctionDeclarationNode> Parser::parseFunctionDeclaration()
{
  const auto mark = tokenizer_.getMark();
  expectToken(TokenType::KeywordFn, "Expected function declaration!");
  const auto name = std::get<std::string>(getToken(TokenType::Identifier, "Expected function name!").value);
  const auto args = parseArgumentList();

  expectToken(TokenType::Colon, "Expected colon!");
  const auto type = parseType();

  auto body = parseBlock();
  auto node = std::make_unique<FunctionDeclarationNode>(name, type, args, std::move(body));
  node->setMark(mark);
  return node;
}